

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop.c
# Opt level: O3

int uv_loop_fork(uv_loop_t *loop)

{
  uv__queue *puVar1;
  uv__io_t *puVar2;
  uv__queue *puVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  
  iVar4 = uv__io_fork(loop);
  if (iVar4 == 0) {
    iVar4 = uv__async_fork(loop);
    if (iVar4 == 0) {
      iVar4 = uv__signal_loop_fork(loop);
      if (iVar4 == 0) {
        uVar6 = loop->nwatchers;
        if (uVar6 != 0) {
          uVar5 = 0;
          do {
            puVar2 = loop->watchers[uVar5];
            if (((puVar2 != (uv__io_t *)0x0) && (puVar2->pevents != 0)) &&
               (puVar1 = &puVar2->watcher_queue, (puVar2->watcher_queue).next == puVar1)) {
              puVar2->events = 0;
              (puVar2->watcher_queue).next = &loop->watcher_queue;
              puVar3 = (loop->watcher_queue).prev;
              (puVar2->watcher_queue).prev = puVar3;
              puVar3->next = puVar1;
              (loop->watcher_queue).prev = puVar1;
              uVar6 = loop->nwatchers;
            }
            uVar5 = uVar5 + 1;
          } while (uVar5 < uVar6);
        }
        iVar4 = 0;
      }
    }
  }
  return iVar4;
}

Assistant:

int uv_loop_fork(uv_loop_t* loop) {
  int err;
  unsigned int i;
  uv__io_t* w;

  err = uv__io_fork(loop);
  if (err)
    return err;

  err = uv__async_fork(loop);
  if (err)
    return err;

  err = uv__signal_loop_fork(loop);
  if (err)
    return err;

  /* Rearm all the watchers that aren't re-queued by the above. */
  for (i = 0; i < loop->nwatchers; i++) {
    w = loop->watchers[i];
    if (w == NULL)
      continue;

    if (w->pevents != 0 && uv__queue_empty(&w->watcher_queue)) {
      w->events = 0; /* Force re-registration in uv__io_poll. */
      uv__queue_insert_tail(&loop->watcher_queue, &w->watcher_queue);
    }
  }

  return 0;
}